

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_property_variant *
nk_property_variant_double
          (nk_property_variant *__return_storage_ptr__,double value,double min_value,
          double max_value,double step)

{
  double step_local;
  double max_value_local;
  double min_value_local;
  double value_local;
  
  __return_storage_ptr__->kind = NK_PROPERTY_DOUBLE;
  (__return_storage_ptr__->value).d = value;
  (__return_storage_ptr__->min_value).d = min_value;
  (__return_storage_ptr__->max_value).d = max_value;
  (__return_storage_ptr__->step).d = step;
  return __return_storage_ptr__;
}

Assistant:

NK_LIB struct nk_property_variant
nk_property_variant_double(double value, double min_value, double max_value,
    double step)
{
    struct nk_property_variant result;
    result.kind = NK_PROPERTY_DOUBLE;
    result.value.d = value;
    result.min_value.d = min_value;
    result.max_value.d = max_value;
    result.step.d = step;
    return result;
}